

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall
tonk::Connection::tonk_send(Connection *this,uint channel,uint8_t *data,uint64_t bytes64)

{
  char *pcVar1;
  LogStringBuffer *pLVar2;
  uint in_EDX;
  long in_RSI;
  ErrorResult *in_RDI;
  uint messageType_1;
  uint messageType;
  size_t bytes;
  Result *result;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffb28;
  LogStringBuffer *in_stack_fffffffffffffb30;
  SessionOutgoing *in_stack_fffffffffffffb38;
  ErrorType type;
  string *in_stack_fffffffffffffb40;
  SessionOutgoing *in_stack_fffffffffffffb48;
  ErrorResult *in_stack_fffffffffffffb50;
  Result *in_stack_fffffffffffffb58;
  LogStringBuffer *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  LogStringBuffer *this_00;
  uint reason;
  LogStringBuffer *this_01;
  string local_430 [16];
  size_t in_stack_fffffffffffffbe0;
  uint8_t *in_stack_fffffffffffffbe8;
  uint in_stack_fffffffffffffbf4;
  SessionOutgoing *in_stack_fffffffffffffbf8;
  undefined8 local_3e8;
  char *local_3e0;
  char *local_3d8;
  int local_3cc;
  char *local_3c8;
  int local_3c0;
  char *local_3b0;
  undefined1 local_3a1;
  undefined8 local_360;
  undefined4 local_354;
  undefined1 *local_350;
  char *local_348;
  undefined8 *local_340;
  undefined8 *local_330;
  char **local_320;
  char **local_310;
  char **local_300;
  char **local_2f0;
  undefined8 local_2d0;
  string *local_2c8;
  char *local_2c0;
  LogStringBuffer *local_2b8;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  string *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  reason = (uint)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  local_3a1 = 0;
  in_RDI->Source = (char *)0x0;
  if (in_EDX == 0xff) {
    SessionOutgoing::QueueUnreliable
              (in_stack_fffffffffffffb48,(MessageType)((ulong)in_stack_fffffffffffffb40 >> 0x20),
               (uint8_t *)in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    local_2f0 = &local_3b0;
    in_RDI->Source = local_3b0;
    local_3b0 = (char *)0x0;
    Result::~Result((Result *)in_stack_fffffffffffffb30);
  }
  else if ((in_EDX < 0x32) || (0x37 < in_EDX)) {
    if ((in_EDX < 0x96) || (0x9b < in_EDX)) {
      if (in_EDX == 200) {
        SessionOutgoing::QueueUnordered
                  (in_stack_fffffffffffffb38,(uint8_t *)in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28);
        local_320 = &local_3e0;
        in_RDI->Source = local_3e0;
        local_3e0 = (char *)0x0;
        Result::~Result((Result *)in_stack_fffffffffffffb30);
      }
      else {
        std::allocator<char>::allocator();
        type = (ErrorType)((ulong)in_stack_fffffffffffffb38 >> 0x20);
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffbf8,
                   "Invalid channel input parameter. See documentation",
                   (allocator *)&stack0xfffffffffffffbf7);
        local_340 = &local_3e8;
        local_348 = "Connection::tonk_send";
        local_350 = &stack0xfffffffffffffbf8;
        local_354 = 0;
        local_360 = 4;
        pcVar1 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40,type,(ErrorCodeT)in_stack_fffffffffffffb30);
        local_330 = &local_3e8;
        in_RDI->Source = pcVar1;
        local_3e8 = 0;
        Result::~Result((Result *)in_stack_fffffffffffffb30);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbf7);
      }
    }
    else {
      local_3cc = in_EDX - 0x84;
      SessionOutgoing::QueueReliable
                (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0);
      local_310 = &local_3d8;
      in_RDI->Source = local_3d8;
      local_3d8 = (char *)0x0;
      Result::~Result((Result *)in_stack_fffffffffffffb30);
    }
  }
  else {
    local_3c0 = in_EDX - 0x2c;
    SessionOutgoing::QueueReliable
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,
               in_stack_fffffffffffffbe0);
    local_300 = &local_3c8;
    in_RDI->Source = local_3c8;
    local_3c8 = (char *)0x0;
    Result::~Result((Result *)in_stack_fffffffffffffb30);
  }
  if (in_RDI->Source != (char *)0x0) {
    pLVar2 = (LogStringBuffer *)(in_RSI + 0x110);
    Result::ToJson_abi_cxx11_(in_stack_fffffffffffffb58);
    local_2c0 = "tonk_send failed: ";
    local_2c8 = local_430;
    local_294 = 4;
    local_2a0 = "tonk_send failed: ";
    local_284 = 4;
    this_01 = pLVar2;
    local_2b8 = pLVar2;
    local_2a8 = local_2c8;
    local_290 = pLVar2;
    local_280 = pLVar2;
    if (*(int *)(in_RSI + 0x118) < 5) {
      local_cc = 4;
      local_d8 = "tonk_send failed: ";
      local_e0 = local_2c8;
      local_c8 = pLVar2;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,Trace);
      local_b0 = &pLVar2->field_0x38;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      this_00 = pLVar2;
      local_a0 = pLVar2;
      local_98 = local_b0;
      local_90 = local_a8;
      local_88 = pLVar2;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,(string *)local_b0);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_20 = local_a8;
      local_28 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      in_stack_fffffffffffffb68 = pLVar2;
      local_58 = pLVar2;
      local_18 = pLVar2;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      local_40 = pLVar2;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write((OutputWorker *)this_00,in_stack_fffffffffffffb68);
      reason = (uint)((ulong)this_00 >> 0x20);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1afdcd);
    }
    std::__cxx11::string::~string(local_430);
    if (in_RDI->Source == (char *)0x0) {
      local_2d0 = 0;
    }
    else {
      local_2d0 = *(undefined8 *)(in_RDI->Source + 0x30);
    }
    RefCounter::StartShutdown((RefCounter *)this_01,reason,(Result *)in_stack_fffffffffffffb68);
  }
  return (Result)in_RDI;
}

Assistant:

Result Connection::tonk_send(unsigned channel, const uint8_t* data, uint64_t bytes64)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    const size_t bytes = static_cast<size_t>(bytes64);
    Result result;

    if (channel == TonkChannel_Unreliable) {
        result = Outgoing.QueueUnreliable(protocol::MessageType_Unreliable, data, bytes);
    }
    else if (channel >= TonkChannel_Reliable0 && channel <= TonkChannel_Reliable0 + TonkChannel_Last) {
        const unsigned messageType = protocol::MessageType_Reliable + channel - TonkChannel_Reliable0;

        result = Outgoing.QueueReliable(messageType, data, bytes);
    }
    else if (channel >= TonkChannel_LowPri0 && channel <= TonkChannel_LowPri0 + TonkChannel_Last) {
        const unsigned messageType = protocol::MessageType_LowPri + channel - TonkChannel_LowPri0;

        result = Outgoing.QueueReliable(messageType, data, bytes);
    }
    else if (channel == TonkChannel_Unordered) {
        result = Outgoing.QueueUnordered(data, bytes);
    }
    else {
        result = Result("Connection::tonk_send", "Invalid channel input parameter. See documentation", ErrorType::Tonk, Tonk_InvalidChannel);
    }

    if (result.IsFail())
    {
        Logger.Error("tonk_send failed: ", result.ToJson());
        SelfRefCount.StartShutdown((unsigned)result.GetErrorCode(), result);
    }

    return result;
}